

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O3

bool __thiscall CS248::Shader::linkProgram(Shader *this)

{
  bool bVar1;
  initializer_list<CS248::internal::GLIntId<CS248::internal::ShaderTag>_> __l;
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  shaders;
  allocator_type local_31;
  undefined8 local_30;
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  local_28;
  
  local_30._0_4_ = this->vertexShaderId_;
  local_30._4_4_ = this->fragmentShaderId_;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_30;
  std::
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  ::vector(&local_28,__l,&local_31);
  bVar1 = GLResourceManager::attachShadersAndLinkProgram
                    (this->gl_mgr_,(ProgramId)(this->programId_).id,&local_28);
  if (local_28.
      super__Vector_base<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool Shader::linkProgram() {
  std::vector<ShaderId> shaders = {vertexShaderId_, fragmentShaderId_};
  return gl_mgr_->attachShadersAndLinkProgram(programId_, shaders);
}